

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::Stdout(string *s)

{
  if ((anonymous_namespace)::s_StdoutCallback_abi_cxx11_._16_8_ != 0) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)(anonymous_namespace)::s_StdoutCallback_abi_cxx11_,s);
    return;
  }
  std::operator<<((ostream *)&std::cout,(string *)s);
  std::ostream::flush();
  return;
}

Assistant:

void cmSystemTools::Stdout(const std::string& s)
{
  if (s_StdoutCallback) {
    s_StdoutCallback(s);
  } else {
    std::cout << s << std::flush;
  }
}